

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzerSettings.cpp
# Opt level: O1

char * __thiscall I2sAnalyzerSettings::SaveSettings(I2sAnalyzerSettings *this)

{
  char *pcVar1;
  SimpleArchive text_archive;
  SimpleArchive aSStack_18 [8];
  
  SimpleArchive::SimpleArchive(aSStack_18);
  SimpleArchive::operator<<(aSStack_18,"SaleaeI2sPcmAnalyzer");
  SimpleArchive::operator<<(aSStack_18,&this->mClockChannel);
  SimpleArchive::operator<<(aSStack_18,&this->mFrameChannel);
  SimpleArchive::operator<<(aSStack_18,&this->mDataChannel);
  SimpleArchive::operator<<(aSStack_18,this->mShiftOrder);
  SimpleArchive::operator<<(aSStack_18,this->mDataValidEdge);
  SimpleArchive::operator<<(aSStack_18,this->mBitsPerWord);
  SimpleArchive::operator<<(aSStack_18,this->mWordAlignment);
  SimpleArchive::operator<<(aSStack_18,this->mFrameType);
  SimpleArchive::operator<<(aSStack_18,this->mBitAlignment);
  SimpleArchive::operator<<(aSStack_18,this->mSigned);
  SimpleArchive::operator<<(aSStack_18,this->mWordSelectInverted);
  SimpleArchive::GetString();
  pcVar1 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(aSStack_18);
  return pcVar1;
}

Assistant:

const char* I2sAnalyzerSettings::SaveSettings()
{ // SaleaeI2sPcmAnalyzer
    SimpleArchive text_archive;

    text_archive << "SaleaeI2sPcmAnalyzer";

    text_archive << mClockChannel;
    text_archive << mFrameChannel;
    text_archive << mDataChannel;

    text_archive << mShiftOrder;
    text_archive << mDataValidEdge;
    text_archive << mBitsPerWord;

    text_archive << mWordAlignment;
    text_archive << mFrameType;
    text_archive << mBitAlignment;

    text_archive << mSigned;

    text_archive << mWordSelectInverted;

    return SetReturnString( text_archive.GetString() );
}